

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::checkContent
          (BooleanDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  bool bVar1;
  uint uVar2;
  DatatypeValidator *pDVar3;
  RegularExpression *this_00;
  InvalidDatatypeValueException *pIVar4;
  XMLCh *text2;
  uint local_48;
  uint i;
  BooleanDatatypeValidator *pBaseValidator;
  MemoryManager *manager_local;
  bool asBase_local;
  ValidationContext *context_local;
  XMLCh *content_local;
  BooleanDatatypeValidator *this_local;
  
  pDVar3 = DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
  if (pDVar3 != (DatatypeValidator *)0x0) {
    (*(pDVar3->super_XSerializable)._vptr_XSerializable[0xc])(pDVar3,content,context,1,manager);
  }
  uVar2 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
  if ((uVar2 & 8) != 0) {
    this_00 = DatatypeValidator::getRegex(&this->super_DatatypeValidator);
    bVar1 = RegularExpression::matches(this_00,content,manager);
    if (!bVar1) {
      pIVar4 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      text2 = DatatypeValidator::getPattern(&this->super_DatatypeValidator);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x69,VALUE_NotMatch_Pattern,content,text2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar4,&InvalidDatatypeValueException::typeinfo,
                  InvalidDatatypeValueException::~InvalidDatatypeValueException);
    }
  }
  if (!asBase) {
    local_48 = 0;
    while ((local_48 < 4 &&
           (bVar1 = XMLString::equals(content,(XMLCh *)(XMLUni::fgBooleanValueSpace +
                                                       (ulong)local_48 * 0x10)), !bVar1))) {
      local_48 = local_48 + 1;
    }
    if (local_48 == 4) {
      pIVar4 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x7e,VALUE_Invalid_Name,content,(XMLCh *)SchemaSymbols::fgDT_BOOLEAN,(XMLCh *)0x0,
                 (XMLCh *)0x0,manager);
      __cxa_throw(pIVar4,&InvalidDatatypeValueException::typeinfo,
                  InvalidDatatypeValueException::~InvalidDatatypeValueException);
    }
  }
  return;
}

Assistant:

void BooleanDatatypeValidator::checkContent( const XMLCh*             const content
                                           ,       ValidationContext* const context
                                           ,       bool                     asBase
                                           ,       MemoryManager*     const manager)
{

    //validate against base validator if any
    BooleanDatatypeValidator *pBaseValidator = (BooleanDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator !=0)
        pBaseValidator->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    unsigned int   i = 0;
    for ( ; i < XMLUni::fgBooleanValueSpaceArraySize; i++ )
    {
        if ( XMLString::equals(content, XMLUni::fgBooleanValueSpace[i]))
            break;
    }

    if (i == XMLUni::fgBooleanValueSpaceArraySize)
        ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                           , XMLExcepts::VALUE_Invalid_Name
                           , content
                           , SchemaSymbols::fgDT_BOOLEAN
                           , manager);
        //Not valid boolean type

}